

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splines.h
# Opt level: O2

array<pbrt::Point3<float>,_7> *
pbrt::SubdivideCubicBezier
          (array<pbrt::Point3<float>,_7> *__return_storage_ptr__,span<const_pbrt::Point3<float>_> cp
          )

{
  Tuple3<pbrt::Point3,_float> *this;
  Tuple3<pbrt::Point3,_float> *this_00;
  Tuple3<pbrt::Point3,_float> *c;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Tuple3<pbrt::Point3,_float> *this_01;
  undefined1 auVar5 [16];
  undefined8 uVar18;
  undefined1 auVar6 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar19 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  Point3<float> PVar20;
  Point3<float> PVar21;
  initializer_list<pbrt::Point3<float>_> v;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  Tuple3<pbrt::Point3,_float> local_e8;
  Tuple3<pbrt::Point3,_float> local_d8;
  Tuple3<pbrt::Point3,_float> local_c8;
  Tuple3<pbrt::Point3,_float> local_b8;
  Tuple3<pbrt::Point3,_float> local_a8;
  Tuple3<pbrt::Point3,_float> local_98;
  Tuple3<pbrt::Point3,_float> local_88;
  undefined8 local_7c;
  float local_74;
  undefined8 local_70;
  float local_68;
  undefined8 local_64;
  float local_5c;
  undefined8 local_58;
  float local_50;
  undefined8 local_4c;
  float local_44;
  undefined8 local_40;
  float local_38;
  undefined8 uVar17;
  
  auVar19 = in_ZMM0._8_56_;
  this_01 = &(cp.ptr)->super_Tuple3<pbrt::Point3,_float>;
  local_88.z = this_01->z;
  this = this_01 + 1;
  local_88.x = this_01->x;
  local_88.y = this_01->y;
  PVar20 = Tuple3<pbrt::Point3,float>::operator+(this_01,(Point3<float> *)this);
  auVar7._0_8_ = PVar20.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar7._8_56_ = auVar19;
  auVar5._8_4_ = 0x3f000000;
  auVar5._0_8_ = 0x3f0000003f000000;
  auVar5._12_4_ = 0x3f000000;
  auVar5 = vmulps_avx512vl(auVar7._0_16_,auVar5);
  auVar19 = ZEXT856(auVar5._8_8_);
  local_74 = PVar20.super_Tuple3<pbrt::Point3,_float>.z * 0.5;
  local_7c = vmovlps_avx(auVar5);
  PVar20 = Tuple3<pbrt::Point3,float>::operator*(this,2);
  local_a8.z = PVar20.super_Tuple3<pbrt::Point3,_float>.z;
  auVar8._0_8_ = PVar20.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8._8_56_ = auVar19;
  local_a8._0_8_ = vmovlps_avx(auVar8._0_16_);
  PVar20 = Tuple3<pbrt::Point3,float>::operator+(this_01,(Point3<float> *)&local_a8);
  local_98.z = PVar20.super_Tuple3<pbrt::Point3,_float>.z;
  auVar9._0_8_ = PVar20.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar9._8_56_ = auVar19;
  this_00 = this_01 + 2;
  local_98._0_8_ = vmovlps_avx(auVar9._0_16_);
  PVar20 = Tuple3<pbrt::Point3,float>::operator+(&local_98,(Point3<float> *)this_00);
  auVar10._0_8_ = PVar20.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar10._8_56_ = auVar19;
  auVar1._8_4_ = 0x3e800000;
  auVar1._0_8_ = 0x3e8000003e800000;
  auVar1._12_4_ = 0x3e800000;
  auVar5 = vmulps_avx512vl(auVar10._0_16_,auVar1);
  auVar19 = ZEXT856(auVar5._8_8_);
  local_68 = PVar20.super_Tuple3<pbrt::Point3,_float>.z * 0.25;
  local_70 = vmovlps_avx(auVar5);
  PVar20 = Tuple3<pbrt::Point3,float>::operator*(this,3);
  uVar17 = auVar19._0_8_;
  local_c8.z = PVar20.super_Tuple3<pbrt::Point3,_float>.z;
  auVar11._0_8_ = PVar20.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar11._8_56_ = auVar19;
  local_c8._0_8_ = vmovlps_avx(auVar11._0_16_);
  PVar20 = Tuple3<pbrt::Point3,float>::operator+(this_01,(Point3<float> *)&local_c8);
  uVar18 = uVar17;
  PVar21 = Tuple3<pbrt::Point3,float>::operator*(this_00,3);
  local_f8 = PVar20.super_Tuple3<pbrt::Point3,_float>.x;
  fStack_f4 = PVar20.super_Tuple3<pbrt::Point3,_float>.y;
  fStack_f0 = (float)uVar17;
  fStack_ec = (float)((ulong)uVar17 >> 0x20);
  auVar6._0_4_ = PVar21.super_Tuple3<pbrt::Point3,_float>.x + local_f8;
  auVar6._4_4_ = PVar21.super_Tuple3<pbrt::Point3,_float>.y + fStack_f4;
  auVar6._8_4_ = (float)uVar18 + fStack_f0;
  auVar6._12_4_ = (float)((ulong)uVar18 >> 0x20) + fStack_ec;
  auVar19 = ZEXT856(auVar6._8_8_);
  local_b8.z = PVar21.super_Tuple3<pbrt::Point3,_float>.z +
               PVar20.super_Tuple3<pbrt::Point3,_float>.z;
  c = this_01 + 3;
  local_b8._0_8_ = vmovlps_avx(auVar6);
  PVar20 = Tuple3<pbrt::Point3,float>::operator+(&local_b8,(Point3<float> *)c);
  auVar12._0_8_ = PVar20.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar12._8_56_ = auVar19;
  auVar2._8_4_ = 0x3e000000;
  auVar2._0_8_ = 0x3e0000003e000000;
  auVar2._12_4_ = 0x3e000000;
  auVar5 = vmulps_avx512vl(auVar12._0_16_,auVar2);
  auVar19 = ZEXT856(auVar5._8_8_);
  local_5c = PVar20.super_Tuple3<pbrt::Point3,_float>.z * 0.125;
  local_64 = vmovlps_avx(auVar5);
  PVar20 = Tuple3<pbrt::Point3,float>::operator*(this_00,2);
  local_e8.z = PVar20.super_Tuple3<pbrt::Point3,_float>.z;
  auVar13._0_8_ = PVar20.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar13._8_56_ = auVar19;
  local_e8._0_8_ = vmovlps_avx(auVar13._0_16_);
  PVar20 = Tuple3<pbrt::Point3,float>::operator+(this,(Point3<float> *)&local_e8);
  local_d8.z = PVar20.super_Tuple3<pbrt::Point3,_float>.z;
  auVar14._0_8_ = PVar20.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar14._8_56_ = auVar19;
  local_d8._0_8_ = vmovlps_avx(auVar14._0_16_);
  PVar20 = Tuple3<pbrt::Point3,float>::operator+(&local_d8,(Point3<float> *)c);
  auVar15._0_8_ = PVar20.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar15._8_56_ = auVar19;
  auVar3._8_4_ = 0x3e800000;
  auVar3._0_8_ = 0x3e8000003e800000;
  auVar3._12_4_ = 0x3e800000;
  auVar5 = vmulps_avx512vl(auVar15._0_16_,auVar3);
  auVar19 = ZEXT856(auVar5._8_8_);
  local_50 = PVar20.super_Tuple3<pbrt::Point3,_float>.z * 0.25;
  local_58 = vmovlps_avx(auVar5);
  PVar20 = Tuple3<pbrt::Point3,float>::operator+(this_00,(Point3<float> *)c);
  auVar16._0_8_ = PVar20.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar16._8_56_ = auVar19;
  auVar4._8_4_ = 0x3f000000;
  auVar4._0_8_ = 0x3f0000003f000000;
  auVar4._12_4_ = 0x3f000000;
  auVar5 = vmulps_avx512vl(auVar16._0_16_,auVar4);
  local_44 = PVar20.super_Tuple3<pbrt::Point3,_float>.z * 0.5;
  local_4c = vmovlps_avx(auVar5);
  local_40._0_4_ = this_01[3].x;
  local_40._4_4_ = this_01[3].y;
  local_38 = this_01[3].z;
  v._M_len = 7;
  v._M_array = (iterator)&local_88;
  pstd::array<pbrt::Point3<float>,_7>::array(__return_storage_ptr__,v);
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU inline pstd::array<Point3f, 7> SubdivideCubicBezier(
    pstd::span<const Point3f> cp) {
    return {cp[0],
            (cp[0] + cp[1]) / 2,
            (cp[0] + 2 * cp[1] + cp[2]) / 4,
            (cp[0] + 3 * cp[1] + 3 * cp[2] + cp[3]) / 8,
            (cp[1] + 2 * cp[2] + cp[3]) / 4,
            (cp[2] + cp[3]) / 2,
            cp[3]};
}